

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr128.c
# Opt level: O0

void ctr128_inc(uchar *counter)

{
  byte bVar1;
  u32 c;
  u32 n;
  uchar *counter_local;
  
  n = 0x10;
  c = 1;
  do {
    n = n - 1;
    bVar1 = counter[n];
    counter[n] = (uchar)(bVar1 + c);
    c = bVar1 + c >> 8;
  } while (n != 0);
  return;
}

Assistant:

static void ctr128_inc(unsigned char *counter)
{
    u32 n = 16, c = 1;

    do {
        --n;
        c += counter[n];
        counter[n] = (u8)c;
        c >>= 8;
    } while (n);
}